

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageForName(Context *this,string *name,bool isDebug)

{
  bool bVar1;
  mapped_type *this_00;
  byte in_CL;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstack::Elf::Object> sVar2;
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  shared_ptr<pstack::Elf::Object> res;
  bool isDebug_local;
  string *name_local;
  Context *this_local;
  shared_ptr<pstack::Elf::Object> *item;
  
  res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       in_CL & 1;
  getImageIfLoaded((Context *)local_38,name);
  bVar1 = std::operator==((shared_ptr<pstack::Elf::Object> *)local_38,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_50[0x13] = 0;
    std::make_shared<pstack::MmapReader,pstack::Context&,std::__cxx11::string_const&>
              ((Context *)local_50,name);
    std::make_shared<pstack::Elf::Object,pstack::Context&,std::shared_ptr<pstack::MmapReader>,bool&>
              (this,(shared_ptr<pstack::MmapReader> *)name,(bool *)local_50);
    std::shared_ptr<pstack::MmapReader>::~shared_ptr((shared_ptr<pstack::MmapReader> *)local_50);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
                            *)&name[1].field_2,(key_type *)CONCAT71(in_register_00000011,isDebug));
    std::shared_ptr<pstack::Elf::Object>::operator=(this_00,(shared_ptr<pstack::Elf::Object> *)this)
    ;
    local_50[0x13] = 1;
  }
  else {
    std::shared_ptr<pstack::Elf::Object>::shared_ptr
              ((shared_ptr<pstack::Elf::Object> *)this,(shared_ptr<pstack::Elf::Object> *)local_38);
  }
  local_50._20_4_ = 1;
  std::shared_ptr<pstack::Elf::Object>::~shared_ptr((shared_ptr<pstack::Elf::Object> *)local_38);
  sVar2.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar2.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageForName(const std::string &name, bool isDebug) {
    auto res = getImageIfLoaded(name);
    if (res != nullptr)
        return res;
    auto item = std::make_shared<Elf::Object>(*this, std::make_shared<MmapReader>(*this, name), isDebug);
    // don't cache negative entries: assign into the cache after we've constructed:
    // a failure to load the image will throw.
    elfCache[name] = item;
    return item;
}